

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::~ConnectResponseImpl
          (ConnectResponseImpl *this)

{
  uint uVar1;
  PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *pPVar2;
  PromiseFulfiller<void> *pPVar3;
  Exception *pEVar4;
  char (*in_RCX) [70];
  Exception local_358;
  String local_1c8;
  undefined1 local_1b0 [8];
  Exception ex;
  ConnectResponseImpl *this_local;
  
  pPVar2 = Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::
           operator->(&this->fulfiller);
  uVar1 = (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((uVar1 & 1) == 0) {
    pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                       (&(this->streamAndFulfiller).fulfiller);
    uVar1 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
    if ((uVar1 & 1) == 0) goto LAB_0078f36c;
  }
  kj::_::Debug::makeDescription<char_const(&)[70]>
            (&local_1c8,
             (Debug *)"\"service\'s connect() implementation never called accept() nor reject()\"",
             "service\'s connect() implementation never called accept() nor reject()",in_RCX);
  Exception::Exception
            ((Exception *)local_1b0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1bca,&local_1c8);
  String::~String(&local_1c8);
  pPVar2 = Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::
           operator->(&this->fulfiller);
  uVar1 = (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((uVar1 & 1) != 0) {
    pPVar2 = Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::
             operator->(&this->fulfiller);
    cp<kj::Exception>(&local_358,(Exception *)local_1b0);
    (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_358);
    Exception::~Exception(&local_358);
  }
  pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     (&(this->streamAndFulfiller).fulfiller);
  uVar1 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((uVar1 & 1) != 0) {
    pPVar3 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                       (&(this->streamAndFulfiller).fulfiller);
    pEVar4 = mv<kj::Exception>((Exception *)local_1b0);
    (**(pPVar3->super_PromiseRejector)._vptr_PromiseRejector)(pPVar3,pEVar4);
  }
  Exception::~Exception((Exception *)local_1b0);
LAB_0078f36c:
  StreamsAndFulfiller::~StreamsAndFulfiller(&this->streamAndFulfiller);
  Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::~Own
            (&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~ConnectResponseImpl() noexcept(false) {
      if (fulfiller->isWaiting() || streamAndFulfiller.fulfiller->isWaiting()) {
        auto ex = KJ_EXCEPTION(FAILED,
            "service's connect() implementation never called accept() nor reject()");
        if (fulfiller->isWaiting()) {
          fulfiller->reject(kj::cp(ex));
        }
        if (streamAndFulfiller.fulfiller->isWaiting()) {
          streamAndFulfiller.fulfiller->reject(kj::mv(ex));
        }
      }
    }